

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool config_find_string(ConfigScanner *sc,char *section,char *name,char **result)

{
  _Bool _Var1;
  ConfigItem *pCVar2;
  
  pCVar2 = config_find(sc,section,name);
  if ((pCVar2 == (ConfigItem *)0x0) || (pCVar2->vtype != VTYPE_STRING)) {
    _Var1 = false;
  }
  else {
    *result = (char *)pCVar2->value;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool config_find_string(ConfigScanner *sc, const char *section, char *name, char **result)
{
	ConfigItem *temp = config_find(sc, section, name);
	if (temp == NULL)
	{
		return false;
	}
	if (temp->vtype == VTYPE_STRING)
	{
		*result = temp->value.v_string;
		return true;
	}
	return false;
}